

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O2

int Cba_BlastReduction(Gia_Man_t *pNew,int *pFans,int nFans,int Type)

{
  int iLit0;
  ulong uVar1;
  ulong uVar2;
  
  if (Type == 0x1b) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)nFans;
    if (nFans < 1) {
      uVar1 = uVar2;
    }
    iLit0 = 1;
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      iLit0 = Gia_ManHashAnd(pNew,iLit0,pFans[uVar2]);
    }
  }
  else if (Type == 0x1d) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)nFans;
    if (nFans < 1) {
      uVar1 = uVar2;
    }
    iLit0 = 0;
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      iLit0 = Gia_ManHashOr(pNew,iLit0,pFans[uVar2]);
    }
  }
  else {
    if (Type != 0x1f) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                    ,0xf7,"int Cba_BlastReduction(Gia_Man_t *, int *, int, int)");
    }
    uVar2 = 0;
    uVar1 = (ulong)(uint)nFans;
    if (nFans < 1) {
      uVar1 = uVar2;
    }
    iLit0 = 0;
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      iLit0 = Gia_ManHashXor(pNew,iLit0,pFans[uVar2]);
    }
  }
  return iLit0;
}

Assistant:

int Cba_BlastReduction( Gia_Man_t * pNew, int * pFans, int nFans, int Type )
{
    if ( Type == CBA_BOX_RAND )
    {
        int k, iLit = 1;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashAnd( pNew, iLit, pFans[k] );
        return iLit;
    }
    if ( Type == CBA_BOX_ROR )
    {
        int k, iLit = 0;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashOr( pNew, iLit, pFans[k] );
        return iLit;
    }
    if ( Type == CBA_BOX_RXOR )
    {
        int k, iLit = 0;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashXor( pNew, iLit, pFans[k] );
        return iLit;
    }
    assert( 0 );
    return -1;
}